

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O1

void __thiscall
MxxColl_All2allvUnknownSize_Test::~MxxColl_All2allvUnknownSize_Test
          (MxxColl_All2allvUnknownSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxColl, All2allvUnknownSize) {
    mxx::comm c;

    std::vector<size_t> send_counts(c.size());
    std::vector<char> msgs;
    for (int i = 0; i < c.size(); ++i) {
        send_counts[i] = (i + c.rank()) % c.size() + 3;
        for (size_t j = 0; j < send_counts[i]; ++j) {
            msgs.push_back('A'+i+j+c.rank());
        }
    }

    // send without knowing the receive count
    std::vector<char> result = mxx::all2allv(msgs, send_counts, c);

    // get the expected receive counts
    std::vector<size_t> actual_recv_count = mxx::all2all(send_counts);
    size_t recv_size = std::accumulate(actual_recv_count.begin(), actual_recv_count.end(), 0);

    ASSERT_EQ(recv_size, result.size());
    std::vector<char>::iterator it = result.begin();
    for (int i = 0; i < c.size(); ++i) {
        for (size_t j = 0; j < actual_recv_count[i]; ++j) {
            ASSERT_EQ((char)('A'+i+c.rank()+j), *it);
            it++;
        }
    }
}